

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

UnicodeSet * __thiscall icu_63::UnicodeSet::retain(UnicodeSet *this,UChar32 start,UChar32 end)

{
  uint uVar1;
  uint uVar2;
  UChar32 range [3];
  uint local_14;
  int local_10;
  undefined4 local_c;
  
  local_14 = 0x10ffff;
  if ((uint)start < 0x10ffff) {
    local_14 = start;
  }
  uVar1 = 0x10ffff;
  if ((uint)end < 0x10ffff) {
    uVar1 = end;
  }
  uVar2 = uVar1;
  if (end < 0) {
    uVar2 = 0;
  }
  if ((start < 0) || (local_14 <= uVar2)) {
    if (start < 0) {
      local_14 = 0;
    }
    local_10 = 1;
    if (-1 < end) {
      local_10 = uVar1 + 1;
    }
    local_c = 0x110000;
    retain(this,(UChar32 *)&local_14,2,'\0');
  }
  else {
    clear(this);
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::retain(UChar32 start, UChar32 end) {
    if (pinCodePoint(start) <= pinCodePoint(end)) {
        UChar32 range[3] = { start, end+1, UNICODESET_HIGH };
        retain(range, 2, 0);
    } else {
        clear();
    }
    return *this;
}